

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O3

int CfdVerifyEcdsaAdaptor
              (void *handle,char *adaptor_signature,char *proof,char *adaptor,char *msg,char *pubkey
              )

{
  bool bVar1;
  CfdException *pCVar2;
  int iVar3;
  allocator local_14d;
  allocator local_14c;
  allocator local_14b;
  allocator local_14a;
  allocator local_149;
  undefined1 local_148 [32];
  Pubkey local_128;
  ByteData256 local_110;
  Pubkey local_f8;
  AdaptorProof local_e0;
  AdaptorSignature local_c8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(adaptor_signature);
  if (bVar1) {
    local_148._0_8_ = "cfdcapi_key.cpp";
    local_148._8_4_ = 0x16c;
    local_148._16_8_ = "CfdVerifyEcdsaAdaptor";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_148,kCfdLogLevelWarning,
               "adaptor_signature is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_148._0_8_ = local_148 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_148,"Failed to parameter. adaptor_signature is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_148);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(proof);
  if (bVar1) {
    local_148._0_8_ = "cfdcapi_key.cpp";
    local_148._8_4_ = 0x172;
    local_148._16_8_ = "CfdVerifyEcdsaAdaptor";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_148,kCfdLogLevelWarning,"proof is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_148._0_8_ = local_148 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_148,"Failed to parameter. proof is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_148);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(adaptor);
  if (bVar1) {
    local_148._0_8_ = "cfdcapi_key.cpp";
    local_148._8_4_ = 0x178;
    local_148._16_8_ = "CfdVerifyEcdsaAdaptor";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_148,kCfdLogLevelWarning,"adaptor is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_148._0_8_ = local_148 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_148,"Failed to parameter. adaptor is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_148);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(msg);
  if (!bVar1) {
    bVar1 = cfd::capi::IsEmptyString(pubkey);
    if (!bVar1) {
      std::__cxx11::string::string((string *)local_148,adaptor_signature,&local_149);
      cfd::core::AdaptorSignature::AdaptorSignature(&local_c8,(string *)local_148);
      std::__cxx11::string::string((string *)&local_50,proof,&local_14a);
      cfd::core::AdaptorProof::AdaptorProof(&local_e0,&local_50);
      std::__cxx11::string::string((string *)&local_70,adaptor,&local_14b);
      cfd::core::Pubkey::Pubkey(&local_f8,&local_70);
      std::__cxx11::string::string((string *)&local_90,msg,&local_14c);
      cfd::core::ByteData256::ByteData256(&local_110,&local_90);
      std::__cxx11::string::string((string *)&local_b0,pubkey,&local_14d);
      cfd::core::Pubkey::Pubkey(&local_128,&local_b0);
      bVar1 = cfd::core::AdaptorUtil::Verify(&local_c8,&local_e0,&local_f8,&local_110,&local_128);
      if (local_128.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_128.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if (local_110.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_110.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if (local_f8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (local_e0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (local_c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
        operator_delete((void *)local_148._0_8_);
      }
      iVar3 = 7;
      if (bVar1) {
        iVar3 = 0;
      }
      return iVar3;
    }
    local_148._0_8_ = "cfdcapi_key.cpp";
    local_148._8_4_ = 0x184;
    local_148._16_8_ = "CfdVerifyEcdsaAdaptor";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_148,kCfdLogLevelWarning,"pubkey is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_148._0_8_ = local_148 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_148,"Failed to parameter. pubkey is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_148);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_148._0_8_ = "cfdcapi_key.cpp";
  local_148._8_4_ = 0x17e;
  local_148._16_8_ = "CfdVerifyEcdsaAdaptor";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_148,kCfdLogLevelWarning,"msg is null or empty.");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  local_148._0_8_ = local_148 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_148,"Failed to parameter. msg is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_148);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdVerifyEcdsaAdaptor(
    void* handle, const char* adaptor_signature, const char* proof,
    const char* adaptor, const char* msg, const char* pubkey) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(adaptor_signature)) {
      warn(CFD_LOG_SOURCE, "adaptor_signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. adaptor_signature is null or empty.");
    }
    if (IsEmptyString(proof)) {
      warn(CFD_LOG_SOURCE, "proof is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. proof is null or empty.");
    }
    if (IsEmptyString(adaptor)) {
      warn(CFD_LOG_SOURCE, "adaptor is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. adaptor is null or empty.");
    }
    if (IsEmptyString(msg)) {
      warn(CFD_LOG_SOURCE, "msg is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. msg is null or empty.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }

    bool is_verify = AdaptorUtil::Verify(
        AdaptorSignature(adaptor_signature), AdaptorProof(proof),
        Pubkey(adaptor), ByteData256(msg), Pubkey(pubkey));
    if (!is_verify) {
      return CfdErrorCode::kCfdSignVerificationError;
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}